

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

size_t __thiscall asmjit::CodeHolder::codeSize(CodeHolder *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  Value VVar5;
  void *pvVar6;
  CodeHolder *pCVar7;
  Slot *pSVar8;
  bool bVar9;
  uint8_t uVar10;
  Error EVar11;
  ulong uVar12;
  size_t sVar13;
  undefined4 extraout_var;
  ulong uVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  AddressTableEntry *pAVar15;
  Slot *pSVar16;
  long lVar17;
  uint64_t *out;
  Value unaff_RBX;
  bool bVar18;
  Value VVar19;
  Value VVar20;
  CodeHolder *self;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  CodeHolder *pCVar24;
  Value unaff_R12;
  undefined8 unaff_R13;
  ulong *puVar25;
  Value unaff_R15;
  ulong auStack_d8 [2];
  Value VStack_c8;
  ulong uStack_c0;
  Slot *pSStack_b8;
  Value VStack_b0;
  Value VStack_a8;
  ulong uStack_a0;
  CodeHolder *pCStack_98;
  Value VStack_90;
  code *pcStack_88;
  CodeHolder *pCStack_78;
  uint uStack_6c;
  size_t sStack_68;
  long lStack_60;
  ulong uStack_58;
  CodeHolder *pCStack_50;
  ulong uStack_48;
  Value *pVStack_40;
  
  uVar12 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (uVar12 == 0) {
    sVar13 = 0;
  }
  else {
    lVar17 = 0;
    self = (CodeHolder *)0x0;
    VVar19.constant = 0;
    do {
      lVar23 = *(long *)((long)(this->_sectionsByOrder).super_ZoneVectorBase._data + lVar17);
      uVar22 = *(ulong *)(lVar23 + 0x50);
      if (*(ulong *)(lVar23 + 0x50) < *(ulong *)(lVar23 + 0x18)) {
        uVar22 = *(ulong *)(lVar23 + 0x18);
      }
      if (uVar22 != 0) {
        pCVar24 = (CodeHolder *)
                  (-(ulong)*(uint *)(lVar23 + 8) &
                  (long)(self->_allocator)._slots + ((ulong)*(uint *)(lVar23 + 8) - 0x49));
        if (pCVar24 < self) {
          codeSize();
          if ((CodeBuffer *)VVar19.constant == (CodeBuffer *)0xffffffffffffffff) {
            return 2;
          }
          self->_baseAddress = (uint64_t)VVar19;
          bVar1 = (self->_environment)._arch;
          uVar22 = CONCAT71((int7)((ulong)unaff_R13 >> 8),bVar1);
          VVar5 = (Value)self->_addressTableSection;
          uVar12 = 0;
          VVar20 = VVar19;
          pCVar24 = self;
          if ((Section *)VVar5.constant == (Section *)0x0) {
            lStack_60 = 0;
          }
          else {
            unaff_R12.expression = (Expression *)(VVar5.constant + 0x48);
            if (*(size_t *)(VVar5.constant + 0x58) < (VVar5.label)->_offset) {
              if ((*(byte *)(VVar5.constant + 0x60) & 2) != 0) {
                return 9;
              }
              pcStack_88 = (code *)0x1148f6;
              VVar20.expression = unaff_R12.expression;
              EVar11 = CodeHolder_reserveInternal
                                 (self,(CodeBuffer *)unaff_R12.expression,(VVar5.label)->_offset);
              unaff_RBX = VVar5;
              unaff_R15 = VVar19;
              if (EVar11 != 0) {
                return CONCAT44(extraout_var,EVar11);
              }
            }
            lStack_60._0_1_ = *(uint8_t *)unaff_R12;
            lStack_60._1_1_ = ((uint8_t *)((long)unaff_R12 + 1))[0];
            lStack_60._2_1_ = ((uint8_t *)((long)unaff_R12 + 1))[1];
            lStack_60._3_1_ = ((uint8_t *)((long)unaff_R12 + 3))[0];
            lStack_60._4_1_ = ((uint8_t *)((long)unaff_R12 + 3))[1];
            lStack_60._5_1_ = ((uint8_t *)((long)unaff_R12 + 3))[2];
            lStack_60._6_1_ = ((uint8_t *)((long)unaff_R12 + 3))[3];
            lStack_60._7_1_ = ((uint8_t *)((long)unaff_R12 + 3))[4];
          }
          uVar14 = (ulong)(self->_relocations).super_ZoneVectorBase._size;
          if (uVar14 == 0) goto LAB_00114bc0;
          unaff_R12 = (Value)(self->_relocations).super_ZoneVectorBase._data;
          pVStack_40 = (Value *)((unaff_R12.expression)->valueType + uVar14 * 8 + -1);
          uStack_58 = (ulong)(bVar1 & 1) ^ 3;
          uVar12 = 0;
          pCStack_50 = self;
          goto LAB_00114950;
        }
        self = (CodeHolder *)((long)(pCVar24->_allocator)._slots + (uVar22 - 0x48));
        VVar19._0_1_ = (byte)VVar19.constant | CARRY8((ulong)pCVar24,uVar22);
        VVar19.constant._1_7_ = 0;
      }
      lVar17 = lVar17 + 8;
    } while (uVar12 << 3 != lVar17);
    sVar13 = -(ulong)((char)VVar19.constant != '\0') | (ulong)self;
  }
  return sVar13;
LAB_00114950:
  unaff_R15.constant = *unaff_R12.constant;
  iVar2 = *(int *)((unaff_R15.expression)->reserved + 1);
  if (iVar2 == 0) goto LAB_00114b34;
  uVar21 = (self->_sections).super_ZoneVectorBase._size;
  if (uVar21 <= *(uint *)((unaff_R15.expression)->value + 1)) {
    pcStack_88 = (code *)0x114c13;
    relocateToBase();
LAB_00114c13:
    uStack_6c = 0x18;
    goto switchD_00114b0c_caseD_3;
  }
  pvVar6 = (self->_sections).super_ZoneVectorBase._data;
  lVar17 = *(long *)((long)pvVar6 + (ulong)*(uint *)((unaff_R15.expression)->value + 1) * 8);
  uVar3 = (unaff_R15.label)->_parentId;
  if ((ulong)uVar3 == 0xffffffff) {
    lVar23 = 0;
  }
  else {
    if (uVar21 <= uVar3) {
      pcStack_88 = (code *)0x114c22;
      relocateToBase();
      return 2;
    }
    lVar23 = *(long *)((long)pvVar6 + (ulong)uVar3 * 8);
  }
  pCVar24 = (CodeHolder *)(unaff_R15.label)->_section;
  uVar14 = (unaff_R15.label)->_offset;
  if (*(ulong *)(lVar17 + 0x50) <= uVar14) goto LAB_00114c13;
  uStack_6c = 0x18;
  out = (uint64_t *)(ulong)*(byte *)((long)(unaff_R15.expression)->value + 2);
  if (((uint64_t *)(*(ulong *)(lVar17 + 0x50) - uVar14) < out) || (4 < iVar2 - 1U))
  goto switchD_00114b0c_caseD_3;
  VVar20 = (Value)((Value *)(lVar17 + 0x10))->expression;
  sStack_68 = *(size_t *)(lVar17 + 0x48);
  unaff_RBX.expression = (Expression *)(*(byte *)((long)(unaff_R15.expression)->value + 4) + uVar14)
  ;
  pCStack_78 = pCVar24;
  switch(iVar2) {
  case 1:
    VVar20.expression = (Expression *)&pCStack_78;
    uVar22 = uVar22 & 0xffffffff;
    pcStack_88 = (code *)0x114a15;
    uStack_48 = uVar12;
    EVar11 = CodeHolder_evaluateExpression(pCVar24,VVar20.expression,out);
    uVar12 = uStack_48;
    self = pCStack_50;
    if (EVar11 != 0) {
      return CONCAT44(extraout_var_00,EVar11);
    }
    break;
  case 2:
    goto switchD_001149fb_caseD_2;
  case 3:
    if (lVar23 == 0) goto switchD_00114b0c_caseD_3;
    pCVar24 = (CodeHolder *)
              ((long)(pCVar24->_allocator)._slots +
              (long)(VVar19.expression[-3].valueType + *(long *)(lVar23 + 0x10) + -1));
    pCStack_78 = pCVar24;
    goto switchD_001149fb_caseD_2;
  case 4:
    VVar20.expression = (Expression *)((VVar20.expression)->valueType + (long)(VVar19.constant - 1))
    ;
    pCStack_78 = (CodeHolder *)
                 ((long)pCVar24 -
                 (long)((long)out + (long)((VVar20.expression)->valueType + (uVar14 - 1))));
    pCVar24 = pCStack_78;
    if ((uVar22 & 1) != 0) goto switchD_001149fb_caseD_2;
    pCVar24 = (CodeHolder *)((ulong)&pCStack_78[0x6bca1a]._addressTableSection >> 0x20);
    if (pCVar24 != (CodeHolder *)0x0) {
LAB_00114bf3:
      uStack_6c = 0x19;
      goto switchD_00114b0c_caseD_3;
    }
    break;
  case 5:
    if ((unaff_RBX.constant < (Section *)0x2) ||
       (*(char *)((long)(unaff_R15.expression)->value + 3) != '\x04'))
    goto switchD_00114b0c_caseD_3;
    pCStack_78 = (CodeHolder *)
                 ((long)pCVar24 -
                 (long)((long)out +
                       (long)((VVar19.expression)->valueType +
                             (long)((VVar20.expression)->valueType + (uVar14 - 2)))));
    if ((CodeHolder *)(long)(int)pCStack_78 == pCStack_78) goto switchD_001149fb_caseD_2;
    pAVar15 = (self->_addressTableEntries)._root;
    while( true ) {
      if (pAVar15 == (AddressTableEntry *)0x0) goto switchD_00114b0c_caseD_3;
      pCVar7 = (CodeHolder *)pAVar15->_address;
      uVar21 = (uint)(pCVar7 >= pCVar24 && pCVar7 != pCVar24) - (uint)(pCVar7 < pCVar24);
      if (uVar21 == 0) break;
      pAVar15 = (AddressTableEntry *)
                ((pAVar15->super_ZoneTreeNodeT<asmjit::AddressTableEntry>).super_ZoneTreeNode.
                 _rbNodeData[uVar21 >> 0x1f] & 0xfffffffffffffffe);
    }
    if ((Section *)VVar5.constant == (Section *)0x0) goto LAB_00114c2e;
    uVar21 = pAVar15->_slot;
    if (uVar21 == 0xffffffff) {
      uVar21 = (uint)uVar12;
      pAVar15->_slot = uVar21;
      uVar12 = (ulong)(uVar21 + 1);
    }
    pCVar24 = (CodeHolder *)((ulong)uVar21 << ((byte)uStack_58 & 0x3f));
    pCStack_78 = (CodeHolder *)
                 (((long)(VVar5.expression)->value[1].expression -
                  (long)((VVar20.expression)->valueType + (uVar14 - 1) + (long)out)) + (long)pCVar24
                 );
    if ((CodeHolder *)(long)(int)pCStack_78 != pCStack_78) goto LAB_00114bf3;
    uVar10 = '\x15';
    if ((unaff_RBX.expression)->valueType[sStack_68 - 2] != 0xe8) {
      if ((unaff_RBX.expression)->valueType[sStack_68 - 2] != 0xe9) goto switchD_00114b0c_caseD_3;
      uVar10 = '%';
    }
    (unaff_RBX.expression)->valueType[sStack_68 - 3] = 0xff;
    (unaff_RBX.expression)->valueType[sStack_68 - 2] = uVar10;
    *(Section **)((long)(pCVar24->_allocator)._slots + lStack_60 + -0x48) =
         (unaff_R15.label)->_section;
  }
LAB_00114aee:
  switch(*(undefined1 *)((long)(unaff_R15.expression)->value + 3)) {
  case 1:
    (unaff_RBX.expression)->valueType[sStack_68 - 1] = (uint8_t)pCStack_78;
    break;
  case 2:
    *(undefined2 *)((unaff_RBX.expression)->valueType + (sStack_68 - 1)) = pCStack_78._0_2_;
    break;
  default:
switchD_00114b0c_caseD_3:
    return (ulong)uStack_6c;
  case 4:
    *(undefined4 *)((unaff_RBX.expression)->valueType + (sStack_68 - 1)) = pCStack_78._0_4_;
    break;
  case 8:
    *(CodeHolder **)((unaff_RBX.expression)->valueType + (sStack_68 - 1)) = pCStack_78;
  }
LAB_00114b34:
  unaff_R12.expression = (Expression *)(unaff_R12.expression)->value;
  if ((Value *)unaff_R12.constant == pVStack_40) goto LAB_00114bc0;
  goto LAB_00114950;
switchD_001149fb_caseD_2:
  goto LAB_00114aee;
LAB_00114bc0:
  sVar4 = (self->_sectionsByOrder).super_ZoneVectorBase._size;
  if (sVar4 != 0) {
    if (*(Section **)
         ((long)(self->_sectionsByOrder).super_ZoneVectorBase._data + (ulong)(sVar4 - 1) * 8) ==
        (Section *)VVar5.constant) {
      uVar12 = (ulong)(uint)((int)uVar12 << ((byte)uVar22 & 1 ^ 3));
      *(ulong *)(VVar5.constant + 0x50) = uVar12;
      (VVar5.label)->_offset = uVar12;
    }
    return 0;
  }
  pcStack_88 = (code *)0x114c2e;
  relocateToBase();
LAB_00114c2e:
  pcStack_88 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar17 = 0;
  puVar25 = auStack_d8;
  bVar9 = true;
  VStack_c8 = VVar20;
  VStack_b0 = unaff_RBX;
  VStack_a8 = unaff_R12;
  uStack_a0 = uVar22;
  pCStack_98 = self;
  VStack_90 = unaff_R15;
  pcStack_88 = (code *)uVar12;
  do {
    bVar18 = bVar9;
    pSVar16 = (Slot *)(ulong)*(byte *)((long)(pCVar24->_allocator)._slots + lVar17 + -0x47);
    if ((Slot *)0x3 < pSVar16) {
      return 3;
    }
    switch(pSVar16) {
    case (Slot *)0x1:
      pSVar16 = (pCVar24->_allocator)._slots[lVar17 + -8];
      break;
    case (Slot *)0x2:
      pSVar16 = (pCVar24->_allocator)._slots[lVar17 + -8];
      pSVar8 = pSVar16[4].next;
      if (pSVar8 == (Slot *)0x0) {
        return 0x43;
      }
      pSVar16 = (Slot *)((long)&(pSVar8[2].next)->next + (long)&(pSVar16[3].next)->next);
      break;
    case (Slot *)0x3:
      EVar11 = CodeHolder_evaluateExpression
                         ((CodeHolder *)(pCVar24->_allocator)._slots[lVar17 + -8],
                          (Expression *)&pSStack_b8,
                          (uint64_t *)
                          ((long)&switchD_00114c75::switchdataD_00136004 +
                          (long)(int)(&switchD_00114c75::switchdataD_00136004)[(long)pSVar16]));
      pSVar16 = pSStack_b8;
      if (EVar11 != 0) {
        return CONCAT44(extraout_var_01,EVar11);
      }
    }
    *puVar25 = (ulong)pSVar16;
    lVar17 = 1;
    puVar25 = &uStack_c0;
    bVar9 = false;
  } while (bVar18);
  switch((pCVar24->_environment)._arch) {
  case '\0':
    uVar12 = uStack_c0 + auStack_d8[0];
    break;
  case '\x01':
    uVar12 = auStack_d8[0] - uStack_c0;
    break;
  case '\x02':
    uVar12 = uStack_c0 * auStack_d8[0];
    break;
  case '\x03':
    auStack_d8[0] = auStack_d8[0] << ((byte)uStack_c0 & 0x3f);
    goto LAB_00114d20;
  case '\x04':
    auStack_d8[0] = auStack_d8[0] >> ((byte)uStack_c0 & 0x3f);
LAB_00114d20:
    uVar12 = 0;
    if (uStack_c0 < 0x40) {
      uVar12 = auStack_d8[0];
    }
    break;
  case '\x05':
    uVar12 = 0x3f;
    if (uStack_c0 < 0x3f) {
      uVar12 = uStack_c0;
    }
    uVar12 = (long)auStack_d8[0] >> ((byte)uVar12 & 0x3f);
    break;
  default:
    return 3;
  }
  (VStack_c8.expression)->opType = (char)uVar12;
  (VStack_c8.expression)->valueType[0] = (char)(uVar12 >> 8);
  (VStack_c8.expression)->valueType[1] = (char)(uVar12 >> 0x10);
  (VStack_c8.expression)->reserved[0] = (char)(uVar12 >> 0x18);
  (VStack_c8.expression)->reserved[1] = (char)(uVar12 >> 0x20);
  (VStack_c8.expression)->reserved[2] = (char)(uVar12 >> 0x28);
  (VStack_c8.expression)->reserved[3] = (char)(uVar12 >> 0x30);
  (VStack_c8.expression)->reserved[4] = (char)(uVar12 >> 0x38);
  return 0;
}

Assistant:

size_t CodeHolder::codeSize() const noexcept {
  Support::FastUInt8 of = 0;
  uint64_t offset = 0;

  for (Section* section : _sectionsByOrder) {
    uint64_t realSize = section->realSize();

    if (realSize) {
      uint64_t alignedOffset = Support::alignUp(offset, section->alignment());
      ASMJIT_ASSERT(alignedOffset >= offset);
      offset = Support::addOverflow(alignedOffset, realSize, &of);
    }
  }

  if ((sizeof(uint64_t) > sizeof(size_t) && offset > SIZE_MAX) || of)
    return SIZE_MAX;

  return size_t(offset);
}